

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

_Bool al_ustr_vappendf(ALLEGRO_USTR *us,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  long in_RDX;
  _al_bstring in_RSI;
  int rc;
  int sz;
  va_list arglist;
  
  do {
    iVar1 = _al_bvcformata(in_RSI,(int)((ulong)in_RDX >> 0x20),*(char **)(in_RDX + 0x10),
                           *(__va_list_tag **)(in_RDX + 8));
    if (-1 < iVar1) {
      return true;
    }
  } while (iVar1 != -1);
  return false;
}

Assistant:

bool al_ustr_vappendf(ALLEGRO_USTR *us, const char *fmt, va_list ap)
{
   va_list arglist;
   int sz;
   int rc;

#ifdef DEBUGMODE
   /* Exercise resizing logic more often. */
   sz = 1;
#else
   sz = 128;
#endif

   for (;;) {
      /* Make a copy of the argument list as vsnprintf() may clobber it. */
      va_copy(arglist, ap);
      rc = _al_bvcformata(us, sz, fmt, arglist);
      va_end(arglist);

      if (rc >= 0) {
         return true;
      }

      if (rc == _AL_BSTR_ERR) {
         /* A real error? */
         return false;
      }

      /* Increase size */
      sz = -rc;
   }
}